

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
          *field)

{
  DataSegmentModuleField *pDVar1;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_50;
  DataSegment *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_38;
  int iStack_34;
  int iStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  pDVar1 = (field->_M_t).
           super___uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
           .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl;
  if ((pDVar1->data_segment).name._M_string_length != 0) {
    local_48 = (DataSegment *)
               (pDVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.loc.
               filename._M_len;
    uStack_40 = *(undefined4 *)
                 &(pDVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.loc.
                  filename._M_str;
    uStack_3c = *(undefined4 *)
                 ((long)&(pDVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).
                         super_ModuleField.loc.filename._M_str + 4);
    local_38 = (pDVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.loc.
               field_1.field_0.line;
    iStack_34 = (pDVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.loc.
                field_1.field_0.first_column;
    iStack_30 = (pDVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.loc.
                field_1.field_0.last_column;
    uStack_2c = *(undefined4 *)
                 ((long)&(pDVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).
                         super_ModuleField.loc.field_1 + 0xc);
    local_28 = (undefined4)
               ((ulong)((long)(this->data_segments).
                              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->data_segments).
                             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string&,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->data_segment_bindings,&(pDVar1->data_segment).name);
  }
  local_48 = &pDVar1->data_segment;
  std::vector<wabt::DataSegment*,std::allocator<wabt::DataSegment*>>::
  emplace_back<wabt::DataSegment*>
            ((vector<wabt::DataSegment*,std::allocator<wabt::DataSegment*>> *)&this->data_segments,
             &local_48);
  local_50._M_head_impl =
       (field->_M_t).
       super___uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
       ._M_t.
       super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
       .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl =
       (DataSegmentModuleField *)0x0;
  intrusive_list<wabt::ModuleField>::push_back
            (&this->fields,
             (unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *)&local_50);
  if (local_50._M_head_impl != (DataSegmentModuleField *)0x0) {
    (*((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  return;
}

Assistant:

void Module::AppendField(std::unique_ptr<DataSegmentModuleField> field) {
  DataSegment& data_segment = field->data_segment;
  if (!data_segment.name.empty()) {
    data_segment_bindings.emplace(data_segment.name,
                                  Binding(field->loc, data_segments.size()));
  }
  data_segments.push_back(&data_segment);
  fields.push_back(std::move(field));
}